

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_is_reg(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  stat st;
  stat local_c0;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,&local_c0);
  if ((iVar1 == 0) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
    if ((local_c0.st_mode & 0xfff) == mode || mode < L'\0') {
      return L'\x01';
    }
    failure_start(file,line,"File %s has wrong mode",pathname);
    logprintf("  Expected: 0%3o\n",(ulong)(uint)mode);
    logprintf("  Found: 0%3o\n",(ulong)(local_c0.st_mode & 0xfff));
  }
  else {
    failure_start(file,line,"File should exist: %s",pathname);
  }
  failure_finish((void *)0x0);
  return L'\0';
}

Assistant:

int
assertion_is_reg(const char *file, int line, const char *pathname, int mode)
{
	struct stat st;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
#endif
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0 || !S_ISREG(st.st_mode)) {
		failure_start(file, line, "File should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	/* Windows doesn't handle permissions the same way as POSIX,
	 * so just ignore the mode tests. */
	/* TODO: Can we do better here? */
	if (mode >= 0 && (mode_t)mode != (st.st_mode & 07777)) {
		failure_start(file, line, "File %s has wrong mode", pathname);
		logprintf("  Expected: 0%3o\n", (unsigned int)mode);
		logprintf("  Found: 0%3o\n", (unsigned int)st.st_mode & 07777);
		failure_finish(NULL);
		return (0);
	}
#endif
	return (1);
}